

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optate.c
# Opt level: O3

void miller_loop(GT *rop,G1 *P,G2 *Q,ATE_CTX *ctx)

{
  fp2_struct_st *pfVar1;
  fp_struct_st *pfVar2;
  fp_struct_st *pfVar3;
  fp_struct_st *pfVar4;
  fp_struct_st *pfVar5;
  G2 *op2;
  long lVar6;
  fp_t tmp3_2;
  fp2_t tmp0;
  G2 r;
  fp2_t tmp1_1;
  fp2_t tmp3_1;
  fp2_t z2;
  fp2_t tmp4;
  G2 t;
  fp2_t r2;
  fp2_t tmp7;
  fp2_t tmp2_1;
  fp6_t tfp62;
  fp2_t dummy;
  fp2_t tmp5;
  G2 minusQ;
  fp12_t dummy2;
  fp12_t dummy1;
  undefined1 local_8f8 [40];
  G2 *local_8d0;
  fp_struct_st *local_8c8;
  long local_8c0;
  fp2_struct_st local_8b8;
  G2 local_878;
  fp2_struct_st local_7b8;
  fp2_struct_st local_778;
  undefined1 local_738 [32];
  undefined1 local_718 [32];
  undefined1 local_6f8 [32];
  undefined1 local_6d8 [32];
  fp6_struct_st local_6b8;
  fp2_struct_st local_5f8;
  fp2_struct_st local_5b8;
  undefined1 local_578 [32];
  undefined1 local_558 [32];
  fp6_struct_st local_538;
  undefined1 local_478 [32];
  undefined1 local_458 [32];
  undefined1 local_438 [32];
  undefined1 local_418 [32];
  G2 local_3f8;
  GT_struct_t local_338;
  GT_struct_t local_1b8;
  
  fp12_setone(rop,ctx->rp);
  G2_set(&local_878,Q);
  G2_set(&local_3f8,Q);
  pfVar3 = ctx->p;
  fp_neg(local_3f8.m_y,local_3f8.m_y,pfVar3);
  pfVar2 = local_3f8.m_y[0].m_b;
  fp_neg(pfVar2,pfVar2,pfVar3);
  pfVar1 = Q->m_y;
  pfVar2 = Q->m_y[0].m_b;
  pfVar4 = ctx->n0;
  local_8d0 = Q;
  bn_mul_mont(&local_1b8,pfVar1,pfVar2,pfVar3,pfVar4,4);
  fp_add(&local_338,pfVar1,pfVar2,pfVar3);
  fp_double(&local_6b8,pfVar1,pfVar3);
  pfVar5 = local_5f8.m_b;
  fp_sub(pfVar5,pfVar2,&local_6b8,pfVar3);
  bn_mul_mont(pfVar5,pfVar5,&local_338,pfVar3,pfVar4,4);
  fp_sub(pfVar5,pfVar5,&local_1b8,pfVar3);
  fp_double(&local_338,&local_1b8,pfVar3);
  fp_add(pfVar5,pfVar5,&local_338,pfVar3);
  fp_double(&local_5f8,&local_1b8,pfVar3);
  if (1 < ctx->naf_len) {
    local_8c8 = P->m_y;
    lVar6 = 1;
    do {
      pfVar1 = local_878.m_z;
      pfVar2 = local_878.m_z[0].m_b;
      local_8c0 = lVar6;
      bn_mul_mont(&local_6b8,pfVar1,pfVar2,pfVar3,pfVar4,4);
      fp_add(&local_538,pfVar1,pfVar2,pfVar3);
      fp_double(local_8f8,pfVar1,pfVar3);
      fp_sub(local_718,pfVar2,local_8f8,pfVar3);
      bn_mul_mont(local_718,local_718,&local_538,pfVar3,pfVar4,4);
      fp_sub(local_718,local_718,&local_6b8,pfVar3);
      fp_double(&local_538,&local_6b8,pfVar3);
      fp_add(local_718,local_718,&local_538,pfVar3);
      fp_double(local_738,&local_6b8,pfVar3);
      pfVar2 = local_878.m_x[0].m_b;
      bn_mul_mont(&local_6b8,&local_878,pfVar2,pfVar3,pfVar4,4);
      fp_add(&local_538,&local_878,pfVar2,pfVar3);
      fp_double(local_8f8,&local_878,pfVar3);
      pfVar5 = local_8b8.m_b;
      fp_sub(pfVar5,pfVar2,local_8f8,pfVar3);
      bn_mul_mont(pfVar5,pfVar5,&local_538,pfVar3,pfVar4,4);
      fp_sub(pfVar5,pfVar5,&local_6b8,pfVar3);
      fp_double(&local_538,&local_6b8,pfVar3);
      fp_add(pfVar5,pfVar5,&local_538,pfVar3);
      fp_double(&local_8b8,&local_6b8,pfVar3);
      pfVar1 = local_878.m_y;
      pfVar2 = local_878.m_y[0].m_b;
      bn_mul_mont(&local_6b8,pfVar1,pfVar2,pfVar3,pfVar4,4);
      fp_add(&local_538,pfVar1,pfVar2,pfVar3);
      fp_double(local_8f8,pfVar1,pfVar3);
      pfVar5 = local_7b8.m_b;
      fp_sub(pfVar5,pfVar2,local_8f8,pfVar3);
      bn_mul_mont(pfVar5,pfVar5,&local_538,pfVar3,pfVar4,4);
      fp_sub(pfVar5,pfVar5,&local_6b8,pfVar3);
      fp_double(&local_538,&local_6b8,pfVar3);
      fp_add(pfVar5,pfVar5,&local_538,pfVar3);
      fp_double(&local_7b8,&local_6b8,pfVar3);
      bn_mul_mont(&local_6b8,&local_7b8,pfVar5,pfVar3,pfVar4,4);
      fp_add(&local_538,&local_7b8,pfVar5,pfVar3);
      fp_double(local_8f8,&local_7b8,pfVar3);
      fp_sub(local_558,pfVar5,local_8f8,pfVar3);
      bn_mul_mont(local_558,local_558,&local_538,pfVar3,pfVar4,4);
      fp_sub(local_558,local_558,&local_6b8,pfVar3);
      fp_double(&local_538,&local_6b8,pfVar3);
      fp_add(local_558,local_558,&local_538,pfVar3);
      fp_double(local_578,&local_6b8,pfVar3);
      fp_add(&local_778,&local_878,&local_7b8,pfVar3);
      pfVar2 = local_778.m_b;
      fp_add(pfVar2,local_878.m_x[0].m_b,local_7b8.m_b,pfVar3);
      bn_mul_mont(&local_6b8,&local_778,pfVar2,pfVar3,pfVar4,4);
      fp_add(&local_538,&local_778,pfVar2,pfVar3);
      fp_double(local_8f8,&local_778,pfVar3);
      fp_sub(pfVar2,pfVar2,local_8f8,pfVar3);
      bn_mul_mont(pfVar2,pfVar2,&local_538,pfVar3,pfVar4,4);
      fp_sub(pfVar2,pfVar2,&local_6b8,pfVar3);
      fp_double(&local_538,&local_6b8,pfVar3);
      fp_add(pfVar2,pfVar2,&local_538,pfVar3);
      fp_double(&local_778,&local_6b8,pfVar3);
      fp_sub(&local_778,&local_778,&local_8b8,pfVar3);
      fp_sub(pfVar2,pfVar2,local_8b8.m_b,pfVar3);
      fp_sub(&local_778,&local_778,local_578,pfVar3);
      fp_sub(pfVar2,pfVar2,local_558,pfVar3);
      fp_double(&local_778,&local_778,pfVar3);
      fp_double(pfVar2,pfVar2,pfVar3);
      fp_triple(local_6f8,&local_8b8,pfVar3);
      fp_triple(local_6d8,local_8b8.m_b,pfVar3);
      fp_add(&local_5b8,local_6f8,&local_878,pfVar3);
      fp_add(local_5b8.m_b,local_6d8,local_878.m_x[0].m_b,pfVar3);
      bn_mul_mont(&local_6b8,local_6f8,local_6d8,pfVar3,pfVar4,4);
      fp_add(&local_538,local_6f8,local_6d8,pfVar3);
      fp_double(local_8f8,local_6f8,pfVar3);
      fp_sub(local_418,local_6d8,local_8f8,pfVar3);
      bn_mul_mont(local_418,local_418,&local_538,pfVar3,pfVar4,4);
      fp_sub(local_418,local_418,&local_6b8,pfVar3);
      fp_double(&local_538,&local_6b8,pfVar3);
      fp_add(local_418,local_418,&local_538,pfVar3);
      fp_double(local_438,&local_6b8,pfVar3);
      fp_sub(&local_878,local_438,&local_778,pfVar3);
      pfVar2 = local_878.m_x[0].m_b;
      fp_sub(pfVar2,local_418,local_778.m_b,pfVar3);
      fp_sub(&local_878,&local_878,&local_778,pfVar3);
      fp_sub(pfVar2,pfVar2,local_778.m_b,pfVar3);
      pfVar1 = local_878.m_z;
      fp_add(pfVar1,local_878.m_y,pfVar1,pfVar3);
      pfVar2 = local_878.m_z[0].m_b;
      fp_add(pfVar2,local_878.m_y[0].m_b,pfVar2,pfVar3);
      bn_mul_mont(&local_6b8,pfVar1,pfVar2,pfVar3,pfVar4,4);
      fp_add(&local_538,pfVar1,pfVar2,pfVar3);
      fp_double(local_8f8,pfVar1,pfVar3);
      fp_sub(pfVar2,pfVar2,local_8f8,pfVar3);
      bn_mul_mont(pfVar2,pfVar2,&local_538,pfVar3,pfVar4,4);
      fp_sub(pfVar2,pfVar2,&local_6b8,pfVar3);
      fp_double(&local_538,&local_6b8,pfVar3);
      fp_add(pfVar2,pfVar2,&local_538,pfVar3);
      pfVar1 = local_878.m_z;
      fp_double(pfVar1,&local_6b8,pfVar3);
      fp_sub(pfVar1,pfVar1,&local_7b8,pfVar3);
      fp_sub(pfVar2,pfVar2,local_7b8.m_b,pfVar3);
      fp_sub(pfVar1,pfVar1,local_738,pfVar3);
      fp_sub(pfVar2,pfVar2,local_718,pfVar3);
      fp_sub(local_878.m_y,&local_778,&local_878,pfVar3);
      pfVar2 = local_878.m_y[0].m_b;
      fp_sub(pfVar2,local_778.m_b,local_878.m_x[0].m_b,pfVar3);
      bn_mul_mont(&local_6b8,local_878.m_y,local_6f8,pfVar3,pfVar4,4);
      bn_mul_mont(&local_538,pfVar2,local_6d8,pfVar3,pfVar4,4);
      fp_add(local_8f8,local_6f8,local_6d8,pfVar3);
      pfVar1 = local_878.m_y;
      fp_add(pfVar1,pfVar1,pfVar2,pfVar3);
      fp_set(pfVar2,(fp_struct_st *)&local_538);
      bn_mul_mont(pfVar1,pfVar1,local_8f8,pfVar3,pfVar4,4);
      fp_sub(pfVar1,pfVar1,&local_6b8,pfVar3);
      fp_sub(pfVar1,pfVar1,pfVar2,pfVar3);
      fp_double(&local_6b8,&local_6b8,pfVar3);
      fp_sub(pfVar2,pfVar2,&local_6b8,pfVar3);
      fp_double(local_478,local_578,pfVar3);
      fp_double(local_458,local_558,pfVar3);
      fp_double(local_478,local_478,pfVar3);
      fp_double(local_458,local_458,pfVar3);
      fp_double(local_478,local_478,pfVar3);
      fp_double(local_458,local_458,pfVar3);
      fp_sub(local_878.m_y,local_878.m_y,local_478,pfVar3);
      fp_sub(pfVar2,pfVar2,local_458,pfVar3);
      bn_mul_mont(&local_6b8,local_6f8,local_738,pfVar3,pfVar4,4);
      bn_mul_mont(&local_538,local_6d8,local_718,pfVar3,pfVar4,4);
      fp_add(local_8f8,local_738,local_718,pfVar3);
      fp_add(&local_778,local_6f8,local_6d8,pfVar3);
      pfVar2 = local_778.m_b;
      fp_set(pfVar2,(fp_struct_st *)&local_538);
      bn_mul_mont(&local_778,&local_778,local_8f8,pfVar3,pfVar4,4);
      fp_sub(&local_778,&local_778,&local_6b8,pfVar3);
      fp_sub(&local_778,&local_778,pfVar2,pfVar3);
      fp_double(&local_6b8,&local_6b8,pfVar3);
      fp_sub(pfVar2,pfVar2,&local_6b8,pfVar3);
      fp_double(&local_778,&local_778,pfVar3);
      fp_double(pfVar2,pfVar2,pfVar3);
      fp_neg(&local_778,&local_778,pfVar3);
      fp_neg(pfVar2,pfVar2,pfVar3);
      bn_mul_mont(&local_778,&local_778,P,pfVar3,pfVar4,4);
      bn_mul_mont(pfVar2,pfVar2,P,pfVar3,pfVar4,4);
      pfVar2 = local_5b8.m_b;
      bn_mul_mont(&local_6b8,&local_5b8,pfVar2,pfVar3,pfVar4,4);
      fp_add(&local_538,&local_5b8,pfVar2,pfVar3);
      fp_double(local_8f8,&local_5b8,pfVar3);
      fp_sub(pfVar2,pfVar2,local_8f8,pfVar3);
      bn_mul_mont(pfVar2,pfVar2,&local_538,pfVar3,pfVar4,4);
      fp_sub(pfVar2,pfVar2,&local_6b8,pfVar3);
      fp_double(&local_538,&local_6b8,pfVar3);
      fp_add(pfVar2,pfVar2,&local_538,pfVar3);
      fp_double(&local_5b8,&local_6b8,pfVar3);
      fp_sub(&local_5b8,&local_5b8,&local_8b8,pfVar3);
      fp_sub(pfVar2,pfVar2,local_8b8.m_b,pfVar3);
      fp_sub(&local_5b8,&local_5b8,local_438,pfVar3);
      fp_sub(pfVar2,pfVar2,local_418,pfVar3);
      fp_double(local_478,&local_7b8,pfVar3);
      fp_double(local_458,local_7b8.m_b,pfVar3);
      fp_double(local_478,local_478,pfVar3);
      fp_double(local_458,local_458,pfVar3);
      fp_sub(&local_5b8,&local_5b8,local_478,pfVar3);
      fp_sub(pfVar2,pfVar2,local_458,pfVar3);
      bn_mul_mont(&local_6b8,local_878.m_z,local_738,pfVar3,pfVar4,4);
      pfVar2 = local_878.m_z[0].m_b;
      bn_mul_mont(&local_538,pfVar2,local_718,pfVar3,pfVar4,4);
      fp_add(local_8f8,local_738,local_718,pfVar3);
      fp_add(&local_8b8,local_878.m_z,pfVar2,pfVar3);
      pfVar2 = local_8b8.m_b;
      fp_set(pfVar2,(fp_struct_st *)&local_538);
      bn_mul_mont(&local_8b8,&local_8b8,local_8f8,pfVar3,pfVar4,4);
      fp_sub(&local_8b8,&local_8b8,&local_6b8,pfVar3);
      fp_sub(&local_8b8,&local_8b8,pfVar2,pfVar3);
      fp_double(&local_6b8,&local_6b8,pfVar3);
      fp_sub(pfVar2,pfVar2,&local_6b8,pfVar3);
      fp_double(&local_8b8,&local_8b8,pfVar3);
      fp_double(pfVar2,pfVar2,pfVar3);
      pfVar5 = local_8c8;
      bn_mul_mont(&local_8b8,&local_8b8,local_8c8,pfVar3,pfVar4,4);
      lVar6 = local_8c0;
      bn_mul_mont(pfVar2,pfVar2,pfVar5,pfVar3,pfVar4,4);
      fp2_setzero(&local_7b8);
      fp6_set_fp2(&local_6b8,&local_7b8,&local_5b8,&local_778);
      fp6_set_fp2(&local_538,&local_7b8,&local_7b8,&local_8b8);
      fp12_set_fp6(&local_1b8,&local_6b8,&local_538);
      fp12_square(rop,rop,ctx);
      fp12_mul_sparse1(rop,rop,&local_1b8,ctx);
      if (ctx->naf[lVar6] == -1) {
        op2 = &local_3f8;
LAB_001224f4:
        linefunction_add_ate(&local_338,&local_878,&local_878,op2,P,&local_5f8,ctx);
        fp12_mul_sparse1(rop,rop,&local_338,ctx);
      }
      else {
        op2 = local_8d0;
        if (ctx->naf[lVar6] == 1) goto LAB_001224f4;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < ctx->naf_len);
  }
  G2_frobenius((G2 *)&local_6b8,local_8d0,ctx);
  pfVar1 = local_6b8.m_b;
  pfVar2 = local_6b8.m_b[0].m_b;
  bn_mul_mont(&local_538,pfVar1,pfVar2,pfVar3,pfVar4,4);
  fp_add(&local_8b8,pfVar1,pfVar2,pfVar3);
  fp_double(&local_7b8,pfVar1,pfVar3);
  pfVar5 = local_5f8.m_b;
  fp_sub(pfVar5,pfVar2,&local_7b8,pfVar3);
  bn_mul_mont(pfVar5,pfVar5,&local_8b8,pfVar3,pfVar4,4);
  fp_sub(pfVar5,pfVar5,&local_538,pfVar3);
  fp_double(&local_8b8,&local_538,pfVar3);
  fp_add(pfVar5,pfVar5,&local_8b8,pfVar3);
  fp_double(&local_5f8,&local_538,pfVar3);
  linefunction_add_ate(&local_1b8,&local_878,&local_878,(G2 *)&local_6b8,P,&local_5f8,ctx);
  G2_frobenius((G2 *)&local_6b8,(G2 *)&local_6b8,ctx);
  pfVar1 = local_6b8.m_b;
  fp_neg(pfVar1,pfVar1,pfVar3);
  pfVar2 = local_6b8.m_b[0].m_b;
  fp_neg(pfVar2,pfVar2,pfVar3);
  bn_mul_mont(&local_538,pfVar1,pfVar2,pfVar3,pfVar4,4);
  fp_add(&local_8b8,pfVar1,pfVar2,pfVar3);
  fp_double(&local_7b8,pfVar1,pfVar3);
  fp_sub(pfVar5,pfVar2,&local_7b8,pfVar3);
  bn_mul_mont(pfVar5,pfVar5,&local_8b8,pfVar3,pfVar4,4);
  fp_sub(pfVar5,pfVar5,&local_538,pfVar3);
  fp_double(&local_8b8,&local_538,pfVar3);
  fp_add(pfVar5,pfVar5,&local_8b8,pfVar3);
  fp_double(&local_5f8,&local_538,pfVar3);
  linefunction_add_ate(&local_338,&local_878,&local_878,(G2 *)&local_6b8,P,&local_5f8,ctx);
  fp12_mul_sparse2(&local_1b8,&local_1b8,&local_338,ctx);
  fp12_mul(rop,rop,&local_1b8,ctx);
  return;
}

Assistant:

void miller_loop(GT *rop, const G1 *P, const G2 *Q, const ATE_CTX *ctx)
{
    // P and Q are assumed to be in affine coordinates!
    fp12_t dummy1, dummy2;
    G2 r, t, minusQ;
    fp2_t r2;
    int i;

    fp12_setone(rop, ctx->rp);

    G2_set(&r, Q);

    G2_set(&minusQ, Q);
    fp2_neg(minusQ.m_y, minusQ.m_y, ctx->p);
    fp2_square(r2, Q->m_y, ctx);

    for (i = 1; i < ctx->naf_len; i++) {
        linefunction_double_ate(dummy1, &r, &r, P, ctx);

        fp12_square(rop, rop, ctx);
        fp12_mul_sparse1(rop, rop, dummy1, ctx);

        if (ctx->naf[i] == 1) {
            linefunction_add_ate(dummy2, &r, &r, Q, P, r2, ctx);
            // fp12_mul_sparse2(dummy1, dummy1, dummy2, ctx);
            fp12_mul_sparse1(rop, rop, dummy2, ctx);
        }
        else if (ctx->naf[i] == -1) {
            linefunction_add_ate(dummy2, &r, &r, &minusQ, P, r2, ctx);
            // fp12_mul_sparse2(dummy1, dummy1, dummy2, ctx);
            fp12_mul_sparse1(rop, rop, dummy2, ctx);
        }
        // fp12_mul(rop, rop, dummy1, ctx);
    }

    G2_frobenius(&t, Q, ctx);
    fp2_square(r2, t.m_y, ctx);
    linefunction_add_ate(dummy1, &r, &r, &t, P, r2, ctx);

    G2_frobenius(&t, &t, ctx);
    fp2_neg(t.m_y, t.m_y, ctx->p);
    fp2_square(r2, t.m_y, ctx);
    linefunction_add_ate(dummy2, &r, &r, &t, P, r2, ctx);

    fp12_mul_sparse2(dummy1, dummy1, dummy2, ctx);
    fp12_mul(rop, rop, dummy1, ctx);
}